

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

bool __thiscall
wasm::Debug::LineState::update(LineState *this,LineTableOpcode *opcode,LineTable *table)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ostream *poVar4;
  Fatal *pFVar5;
  Fatal local_368;
  int32_t LineOffset;
  uint64_t AddrOffset_1;
  uint8_t AdjustOpcode_1;
  uint64_t AddrOffset;
  uint8_t AdjustOpcode;
  Fatal local_1b0;
  LineTable *local_28;
  LineTable *table_local;
  LineTableOpcode *opcode_local;
  LineState *this_local;
  
  local_28 = table;
  table_local = (LineTable *)opcode;
  opcode_local = (LineTableOpcode *)this;
  switch(opcode->Opcode) {
  case DW_LNS_extended_op:
    switch(opcode->SubOpcode) {
    case DW_LNE_end_sequence:
      return true;
    case DW_LNE_set_address:
      this->addr = (uint32_t)opcode->Data;
      break;
    case DW_LNE_define_file:
      Fatal::Fatal(&local_1b0);
      Fatal::operator<<(&local_1b0,(char (*) [25])"TODO: DW_LNE_define_file");
      Fatal::~Fatal(&local_1b0);
    case DW_LNE_set_discriminator:
      this->discriminator = (uint32_t)opcode->Data;
      break;
    default:
      poVar4 = std::operator<<((ostream *)&std::cerr,"warning: unknown subopcode ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)(table_local->Length).TotalLength64);
      std::operator<<(poVar4," (this may be an unsupported version of DWARF)\n");
    }
    break;
  case DW_LNS_copy:
    return true;
  case DW_LNS_advance_pc:
    if (table->MinInstLength != '\x01') {
      std::operator<<((ostream *)&std::cerr,
                      "warning: bad MinInstLength (this may be an unsupported DWARF version)");
    }
    this->addr = this->addr + (int)*(undefined8 *)&table_local->Version;
    break;
  case DW_LNS_advance_line:
    this->line = this->line + (int)opcode->SData;
    break;
  case DW_LNS_set_file:
    this->file = (uint32_t)opcode->Data;
    break;
  case DW_LNS_set_column:
    this->col = (uint32_t)opcode->Data;
    break;
  case DW_LNS_negate_stmt:
    this->isStmt = (bool)((this->isStmt ^ 0xffU) & 1);
    break;
  case DW_LNS_set_basic_block:
    this->basicBlock = true;
    break;
  case DW_LNS_const_add_pc:
    this->addr = this->addr +
                 (int)((ulong)(byte)(-table->OpcodeBase - 1) /
                      (ulong)(long)(int)(uint)table->LineRange) * (uint)table->MinInstLength;
    break;
  case DW_LNS_fixed_advance_pc:
    this->addr = this->addr + (int)opcode->Data;
    break;
  case DW_LNS_set_prologue_end:
    this->prologueEnd = true;
    break;
  default:
    if (table->OpcodeBase <= opcode->Opcode) {
      bVar3 = opcode->Opcode - table->OpcodeBase;
      bVar1 = table->LineRange;
      bVar2 = table->MinInstLength;
      this->line = (int)table->LineBase +
                   (int)((ulong)bVar3 % (ulong)(long)(int)(uint)table->LineRange) + this->line;
      this->addr = this->addr + (int)((ulong)bVar3 / (ulong)(long)(int)(uint)bVar1) * (uint)bVar2;
      return true;
    }
    Fatal::Fatal(&local_368);
    pFVar5 = Fatal::operator<<(&local_368,(char (*) [28])"unknown debug line opcode: ");
    pFVar5 = Fatal::operator<<(pFVar5,std::hex);
    Fatal::operator<<(pFVar5,(LineNumberOps *)table_local);
    Fatal::~Fatal(&local_368);
  case DW_LNS_set_isa:
    this->isa = (uint32_t)opcode->Data;
  }
  return false;
}

Assistant:

bool update(llvm::DWARFYAML::LineTableOpcode& opcode,
              const llvm::DWARFYAML::LineTable& table) {
    switch (opcode.Opcode) {
      case 0: {
        // Extended opcodes
        switch (opcode.SubOpcode) {
          case llvm::dwarf::DW_LNE_set_address: {
            addr = opcode.Data;
            break;
          }
          case llvm::dwarf::DW_LNE_end_sequence: {
            return true;
          }
          case llvm::dwarf::DW_LNE_set_discriminator: {
            discriminator = opcode.Data;
            break;
          }
          case llvm::dwarf::DW_LNE_define_file: {
            Fatal() << "TODO: DW_LNE_define_file";
          }
          default: {
            // An unknown opcode, ignore.
            std::cerr << "warning: unknown subopcode " << opcode.SubOpcode
                      << " (this may be an unsupported version of DWARF)\n";
          }
        }
        break;
      }
      case llvm::dwarf::DW_LNS_set_column: {
        col = opcode.Data;
        break;
      }
      case llvm::dwarf::DW_LNS_set_prologue_end: {
        prologueEnd = true;
        break;
      }
      case llvm::dwarf::DW_LNS_copy: {
        return true;
      }
      case llvm::dwarf::DW_LNS_advance_pc: {
        if (table.MinInstLength != 1) {
          std::cerr << "warning: bad MinInstLength "
                       "(this may be an unsupported DWARF version)";
        }
        addr += opcode.Data;
        break;
      }
      case llvm::dwarf::DW_LNS_advance_line: {
        line += opcode.SData;
        break;
      }
      case llvm::dwarf::DW_LNS_set_file: {
        file = opcode.Data;
        break;
      }
      case llvm::dwarf::DW_LNS_negate_stmt: {
        isStmt = !isStmt;
        break;
      }
      case llvm::dwarf::DW_LNS_set_basic_block: {
        basicBlock = true;
        break;
      }
      case llvm::dwarf::DW_LNS_const_add_pc: {
        uint8_t AdjustOpcode = 255 - table.OpcodeBase;
        uint64_t AddrOffset =
          (AdjustOpcode / table.LineRange) * table.MinInstLength;
        addr += AddrOffset;
        break;
      }
      case llvm::dwarf::DW_LNS_fixed_advance_pc: {
        addr += opcode.Data;
        break;
      }
      case llvm::dwarf::DW_LNS_set_isa: {
        isa = opcode.Data;
        break;
      }
      default: {
        if (opcode.Opcode >= table.OpcodeBase) {
          // Special opcode: adjust line and addr, using some math.
          uint8_t AdjustOpcode =
            opcode.Opcode - table.OpcodeBase; // 20 - 13 = 7
          uint64_t AddrOffset = (AdjustOpcode / table.LineRange) *
                                table.MinInstLength; // (7 / 14) * 1 = 0
          int32_t LineOffset =
            table.LineBase +
            (AdjustOpcode % table.LineRange); // -5 + (7 % 14) = 2
          line += LineOffset;
          addr += AddrOffset;
          return true;
        } else {
          Fatal() << "unknown debug line opcode: " << std::hex << opcode.Opcode;
        }
      }
    }
    return false;
  }